

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

ssize_t Curl_recv_plain(connectdata *conn,int num,char *buf,size_t len,CURLcode *code)

{
  int err;
  SessionHandle *data;
  CURLcode CVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  
  sVar2 = recv(conn->sock[num],buf,len,0);
  *code = CURLE_OK;
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    err = *piVar3;
    CVar1 = CURLE_AGAIN;
    if ((err != 4) && (err != 0xb)) {
      data = conn->data;
      pcVar4 = Curl_strerror(conn,err);
      Curl_failf(data,"Recv failure: %s",pcVar4);
      (conn->data->state).os_errno = err;
      CVar1 = CURLE_RECV_ERROR;
    }
    *code = CVar1;
  }
  return sVar2;
}

Assistant:

ssize_t Curl_recv_plain(struct connectdata *conn, int num, char *buf,
                        size_t len, CURLcode *code)
{
  curl_socket_t sockfd = conn->sock[num];
  ssize_t nread = sread(sockfd, buf, len);

  *code = CURLE_OK;
  if(-1 == nread) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefor
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *code = CURLE_AGAIN;
    }
    else {
      failf(conn->data, "Recv failure: %s",
            Curl_strerror(conn, err));
      conn->data->state.os_errno = err;
      *code = CURLE_RECV_ERROR;
    }
  }
  return nread;
}